

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

string * __thiscall
duckdb::BindContext::BindColumn
          (string *__return_storage_ptr__,BindContext *this,PositionalReferenceExpression *ref,
          string *table_name,string *column_name)

{
  pointer puVar1;
  type pBVar2;
  ulong uVar3;
  ulong __n;
  unsigned_long params;
  pointer this_00;
  allocator local_61;
  string *local_60;
  string *local_58;
  string local_50 [32];
  
  this_00 = (this->bindings_list).
            super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->bindings_list).
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  params = 0;
  __n = ref->index - 1;
  local_60 = table_name;
  local_58 = column_name;
  while( true ) {
    if (this_00 == puVar1) {
      ::std::__cxx11::string::string
                (local_50,"Positional reference %d out of range (total %d columns)",&local_61);
      Exception::ConstructMessage<unsigned_long,unsigned_long>
                (__return_storage_ptr__,(Exception *)local_50,(string *)ref->index,params,
                 (unsigned_long)column_name);
      ::std::__cxx11::string::~string(local_50);
      return __return_storage_ptr__;
    }
    pBVar2 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator*
                       (this_00);
    if (ref->index == 0) break;
    uVar3 = (long)(pBVar2->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar2->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (__n < uVar3) {
      BindingAlias::GetAlias_abi_cxx11_(&pBVar2->alias);
      ::std::__cxx11::string::_M_assign((string *)local_60);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::get<true>(&pBVar2->names,__n);
      ::std::__cxx11::string::_M_assign((string *)local_58);
      goto LAB_01310383;
    }
    params = params + uVar3;
    this_00 = this_00 + 1;
    __n = __n - uVar3;
  }
  BindingAlias::GetAlias_abi_cxx11_(&pBVar2->alias);
  ::std::__cxx11::string::_M_assign((string *)local_60);
  ::std::__cxx11::string::assign((char *)local_58);
LAB_01310383:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string BindContext::BindColumn(PositionalReferenceExpression &ref, string &table_name, string &column_name) {
	idx_t total_columns = 0;
	idx_t current_position = ref.index - 1;
	for (auto &entry : bindings_list) {
		auto &binding = *entry;
		idx_t entry_column_count = binding.names.size();
		if (ref.index == 0) {
			// this is a row id
			table_name = binding.alias.GetAlias();
			column_name = "rowid";
			return string();
		}
		if (current_position < entry_column_count) {
			table_name = binding.alias.GetAlias();
			column_name = binding.names[current_position];
			return string();
		} else {
			total_columns += entry_column_count;
			current_position -= entry_column_count;
		}
	}
	return StringUtil::Format("Positional reference %d out of range (total %d columns)", ref.index, total_columns);
}